

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_setmetatable(lua_State *L)

{
  int iVar1;
  
  iVar1 = lua_type(L,2);
  luaL_checktype(L,1,5);
  if ((iVar1 != 0) && (iVar1 != 5)) {
    luaL_argerror(L,2,"nil or table expected");
  }
  iVar1 = luaL_getmetafield(L,1,"__metatable");
  if (iVar1 != 0) {
    iVar1 = luaL_error(L,"cannot change a protected metatable");
    return iVar1;
  }
  lua_settop(L,2);
  lua_setmetatable(L,1);
  return 1;
}

Assistant:

static int luaB_setmetatable (lua_State *L) {
  int t = lua_type(L, 2);
  luaL_checktype(L, 1, LUA_TTABLE);
  luaL_argcheck(L, t == LUA_TNIL || t == LUA_TTABLE, 2,
                    "nil or table expected");
  if (luaL_getmetafield(L, 1, "__metatable") != LUA_TNIL)
    return luaL_error(L, "cannot change a protected metatable");
  lua_settop(L, 2);
  lua_setmetatable(L, 1);
  return 1;
}